

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::processCommand(CommonCore *this,ActionMessage *command)

{
  double __t;
  string_view name;
  string_view string1;
  string_view federateName;
  string_view federateName_00;
  string_view value;
  string_view tag_00;
  string_view message;
  format_args args;
  format_args args_00;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  __type_conflict _Var1;
  FederateStates FVar2;
  bool bVar3;
  __int_type _Var4;
  action_t aVar5;
  GlobalFederateId GVar6;
  BasicHandleInfo *this_00;
  FederateState *pFVar7;
  ActionMessage *in_RSI;
  CommonCore *in_RDI;
  ActionMessage *in_stack_00000020;
  FederateState *in_stack_00000028;
  optional<helics::ActionMessage> rep;
  FederateState *fed_3;
  BasicHandleInfo *handle;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *tag;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  string *keyTag;
  ActionMessage dep;
  FederateState *fed_2;
  FederateState *fed_1;
  FederateState *fed;
  string *target;
  bool afed;
  anon_class_1_0_00000001 pred;
  bool res;
  ActionMessage reg;
  ActionMessage pngrep;
  undefined4 in_stack_fffffffffffff6e8;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff6ec;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffff6f0;
  undefined4 uVar10;
  int in_stack_fffffffffffff6f4;
  undefined4 uVar11;
  value_type *in_stack_fffffffffffff6f8;
  undefined4 in_stack_fffffffffffff700;
  action_t in_stack_fffffffffffff704;
  GlobalHandle in_stack_fffffffffffff708;
  InterfaceHandle startingAction;
  CommonCore *in_stack_fffffffffffff710;
  CommonCore *in_stack_fffffffffffff718;
  CommonCore *in_stack_fffffffffffff720;
  CommonCore *in_stack_fffffffffffff728;
  CommonCore *in_stack_fffffffffffff730;
  GlobalFederateId federateID;
  size_t in_stack_fffffffffffff738;
  HandleManager *pHVar12;
  char *in_stack_fffffffffffff740;
  ActionMessage *in_stack_fffffffffffff748;
  CommonCore *in_stack_fffffffffffff750;
  GlobalFederateId *this_01;
  BrokerBase *in_stack_fffffffffffff770;
  ActionMessage *in_stack_fffffffffffff778;
  CommonCore *in_stack_fffffffffffff780;
  atomic<double> *this_02;
  ActionMessage *in_stack_fffffffffffff798;
  CommonCore *in_stack_fffffffffffff7a0;
  undefined7 in_stack_fffffffffffff7b8;
  undefined1 in_stack_fffffffffffff7bf;
  byte bVar13;
  CommonCore *in_stack_fffffffffffff7c0;
  undefined4 in_stack_fffffffffffff7d0;
  FederateState *in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7f4;
  ActionMessage *in_stack_fffffffffffff7f8;
  CommonCore *in_stack_fffffffffffff800;
  CommonCore *in_stack_fffffffffffff808;
  GlobalFederateId in_stack_fffffffffffff814;
  undefined1 in_stack_fffffffffffff84b;
  int in_stack_fffffffffffff84c;
  BrokerBase *in_stack_fffffffffffff850;
  string_view in_stack_fffffffffffff858;
  undefined4 in_stack_fffffffffffff868;
  GlobalFederateId in_stack_fffffffffffff86c;
  CommonCore *in_stack_fffffffffffff870;
  ActionMessage *in_stack_fffffffffffff880;
  CommonCore *in_stack_fffffffffffff888;
  ActionMessage *in_stack_fffffffffffff8a8;
  CommonCore *in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b8;
  undefined4 in_stack_fffffffffffff8bc;
  GlobalFederateId local_72c;
  string_view local_728;
  BaseType local_718;
  undefined4 local_714;
  ActionMessage *local_710;
  ActionMessage *cmd;
  undefined1 in_stack_fffffffffffff900 [16];
  CommonCore *in_stack_fffffffffffff910;
  ActionMessage *in_stack_fffffffffffff928;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff954;
  undefined4 in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff95c;
  string_view in_stack_fffffffffffff960;
  ActionMessage *in_stack_fffffffffffff988;
  CommonCore *in_stack_fffffffffffff990;
  ActionMessage *in_stack_fffffffffffff998;
  CommonCore *in_stack_fffffffffffff9a0;
  ActionMessage *in_stack_fffffffffffff9b0;
  ActionMessage *in_stack_fffffffffffff9e8;
  CommonCore *in_stack_fffffffffffff9f0;
  GlobalFederateId local_524;
  string_view local_520;
  FederateState *local_510;
  BaseType local_504;
  FederateState *local_500;
  BaseType local_4f4;
  __sv_type local_4f0;
  FederateState *local_4e0;
  string *local_4d8;
  undefined4 local_4cc;
  BaseType local_4c8;
  BaseType local_4c4;
  BaseType local_4c0;
  BaseType local_4bc;
  BaseType local_4b8;
  BaseType local_4b4;
  size_t local_4b0;
  ActionMessage *in_stack_fffffffffffffb58;
  char *pcVar14;
  CommonCore *in_stack_fffffffffffffb60;
  undefined8 uVar15;
  undefined1 local_498 [32];
  __sv_type local_478;
  __sv_type local_468;
  BaseType local_454;
  GlobalFederateId local_450 [10];
  undefined4 uStack_428;
  undefined4 uStack_424;
  byte local_417 [3];
  undefined4 local_414;
  __sv_type local_410;
  ActionMessage *local_400;
  ActionMessage *cmd_00;
  undefined4 in_stack_fffffffffffffc10;
  GlobalFederateId in_stack_fffffffffffffc14;
  ActionMessage local_3e8;
  undefined8 local_330;
  undefined8 uStack_328;
  __sv_type local_320;
  BaseType local_30c;
  GlobalFederateId local_308;
  GlobalBrokerId local_304;
  undefined4 local_300;
  GlobalBrokerId local_2fc [5];
  __sv_type local_2e8;
  BaseType local_2d4;
  GlobalFederateId local_2d0;
  BaseType local_2cc;
  BaseType local_2c8;
  GlobalFederateId local_2c4 [3];
  BaseType local_2b8;
  BaseType local_2b0;
  ActionMessage *in_stack_fffffffffffffd80;
  CommonCore *in_stack_fffffffffffffd88;
  BaseType local_1f4;
  undefined1 local_1f0 [32];
  char *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [32];
  __sv_type local_1a0;
  __sv_type local_190;
  BaseType local_180;
  GlobalFederateId local_17c;
  ActionMessage *local_178;
  ActionMessage *in_stack_fffffffffffffe98;
  CommonCore *in_stack_fffffffffffffea0;
  BaseType local_158 [4];
  undefined8 local_148;
  undefined1 *local_140;
  char *local_138;
  undefined8 uStack_130;
  BaseType *local_120;
  undefined1 *local_118;
  char *local_110;
  undefined8 uStack_108;
  undefined1 *local_100;
  byte local_f8 [16];
  undefined1 local_e8 [16];
  byte local_d8 [16];
  undefined8 local_c8;
  byte *local_c0;
  char *local_b8;
  undefined8 uStack_b0;
  byte *local_a0;
  size_t *local_98;
  byte *local_90;
  char *local_88;
  undefined8 uStack_80;
  undefined1 *local_78;
  BaseType local_6c;
  BaseType *local_68;
  undefined1 *local_58;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined8 *local_38;
  byte local_29;
  byte *local_28;
  byte local_19;
  byte *local_18;
  byte *local_10;
  undefined8 *local_8;
  
  local_178 = in_RSI;
  cmd = local_710;
  cmd_00 = local_400;
  _Var4 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_fffffffffffff6f8);
  if (0x17 < _Var4) {
    in_stack_fffffffffffff7d8 = (FederateState *)&in_RDI->super_BrokerBase;
    local_180 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
    GlobalFederateId::GlobalFederateId(&local_17c,(GlobalBrokerId)local_180);
    getIdentifier_abi_cxx11_(in_RDI);
    local_190 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
    local_1d0 = "|| cmd:{} from {}";
    local_1c8 = 0x11;
    prettyPrintString_abi_cxx11_(in_stack_fffffffffffff9b0);
    local_1f4 = GlobalFederateId::baseValue(&local_178->source_id);
    local_100 = local_1c0;
    local_110 = local_1d0;
    uStack_108 = local_1c8;
    local_118 = local_1f0;
    local_120 = &local_1f4;
    local_138 = local_1d0;
    uStack_130 = local_1c8;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)
               CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff6f8);
    local_68 = local_158;
    local_6c = *local_120;
    local_38 = &local_148;
    local_40 = &stack0xfffffffffffffe98;
    local_148 = 0x1d;
    args.desc_._4_4_ = in_stack_fffffffffffff954;
    args.desc_._0_4_ = in_stack_fffffffffffff950;
    args.field_1._0_4_ = in_stack_fffffffffffff958;
    args.field_1._4_4_ = in_stack_fffffffffffff95c;
    local_158[0] = local_6c;
    local_140 = local_40;
    ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffff960,args);
    local_1a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
    in_stack_fffffffffffff6e8 = (undefined4)local_1a0._M_len;
    in_stack_fffffffffffff6ec = local_1a0._M_len._4_4_;
    in_stack_fffffffffffff6f0 = local_1a0._M_str._0_4_;
    in_stack_fffffffffffff6f4 = local_1a0._M_str._4_4_;
    message_00._M_str = (char *)in_stack_fffffffffffff998;
    message_00._M_len = (size_t)in_stack_fffffffffffff990;
    BrokerBase::sendToLogger
              (in_stack_fffffffffffff850,in_stack_fffffffffffff86c,in_stack_fffffffffffff84c,
               in_stack_fffffffffffff858,message_00,(bool)in_stack_fffffffffffff84b);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
  }
  aVar5 = ActionMessage::action(local_178);
  if (aVar5 == cmd_broker_setup) {
LAB_0054c869:
    bVar3 = GlobalFederateId::operator==
                      (&local_178->dest_id,
                       (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
    if (!bVar3) {
      return;
    }
    ActionMessage::ActionMessage
              ((ActionMessage *)in_stack_fffffffffffff710,in_stack_fffffffffffff708.handle.hid.hid);
    local_2b0 = (local_178->source_id).gid;
    local_2c8 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
    GlobalFederateId::GlobalFederateId(local_2c4,(GlobalBrokerId)local_2c8);
    local_2b8 = local_2c4[0].gid;
    routeMessage(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    ActionMessage::~ActionMessage
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
    return;
  }
  if (aVar5 == cmd_ignore) {
    return;
  }
  if (aVar5 == cmd_tick) {
    processTimingTick(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    return;
  }
  if (((uint)(aVar5 + (cmd_route_ack|cmd_init_not_ready|cmd_user_disconnect)) < 2) ||
     ((uint)(aVar5 + (cmd_route_ack|cmd_init_grant)) < 3)) {
LAB_0054d073:
    processDisconnectCommand(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    return;
  }
  if ((uint)(aVar5 + (cmd_route_ack|cmd_disconnect_fed)) < 2) {
    processInitRequest(in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    return;
  }
  if (aVar5 != cmd_exec_request) {
    if (aVar5 != cmd_exec_grant) {
      if (aVar5 == cmd_stop) goto LAB_0054d073;
      if (aVar5 == cmd_time_grant) {
        local_4b8 = (in_RDI->keyFed).gid;
        bVar3 = GlobalFederateId::operator==(&local_178->source_id,(GlobalFederateId)local_4b8);
        if (bVar3) {
          this_02 = &in_RDI->simTime;
          __t = TimeRepresentation::operator_cast_to_double
                          ((TimeRepresentation<count_time<9,_long>_> *)0x54d152);
          std::__atomic_float<double>::store(&this_02->super___atomic_float<double>,__t,seq_cst);
        }
LAB_0054d166:
        GVar6.gid = (BaseType)in_stack_fffffffffffff710;
        local_4bc = (local_178->source_id).gid;
        bVar3 = isLocal(in_stack_fffffffffffff718,
                        (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffff720 >> 0x20));
        if (bVar3) {
          local_4c0 = (local_178->source_id).gid;
          bVar3 = hasTimeBlock((CommonCore *)in_stack_fffffffffffff708,GVar6);
          if (bVar3) {
            local_4c4 = GlobalFederateId::baseValue(&local_178->source_id);
            std::
            map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
            ::operator[]((map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                          *)in_stack_fffffffffffff730,
                         (key_type_conflict2 *)in_stack_fffffffffffff728);
            std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                      ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                       CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                       in_stack_fffffffffffff6f8);
            return;
          }
        }
        routeMessage(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
        return;
      }
      if (aVar5 == cmd_request_current_time) {
        bVar3 = isLocal(in_stack_fffffffffffff718,
                        (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffff720 >> 0x20));
        if (!bVar3) {
          routeMessage(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
          return;
        }
        pFVar7 = getFederateCore(in_stack_fffffffffffff728,
                                 (GlobalFederateId)
                                 (BaseType)((ulong)in_stack_fffffffffffff730 >> 0x20));
        if (pFVar7 == (FederateState *)0x0) {
          return;
        }
        FVar2 = FederateState::getState((FederateState *)0x54dca6);
        if ((FVar2 != FINISHED) &&
           (FVar2 = FederateState::getState((FederateState *)0x54dcb7), FVar2 != ERRORED)) {
          FederateState::forceProcessMessage
                    ((FederateState *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                     (ActionMessage *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8))
          ;
          return;
        }
        FederateState::processPostTerminationAction
                  (in_stack_fffffffffffff7d8,
                   (ActionMessage *)CONCAT44(aVar5,in_stack_fffffffffffff7d0));
        bVar3 = std::optional::operator_cast_to_bool((optional<helics::ActionMessage> *)0x54dcff);
        if (bVar3) {
          std::optional<helics::ActionMessage>::operator*
                    ((optional<helics::ActionMessage> *)0x54dd12);
          routeMessage(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
        }
        std::optional<helics::ActionMessage>::~optional((optional<helics::ActionMessage> *)0x54dd59)
        ;
        return;
      }
      if ((uint)(aVar5 + ~(cmd_request_current_time|cmd_tick)) < 2) {
        manageTimeBlocks(in_stack_fffffffffffff750,in_stack_fffffffffffff748);
        return;
      }
      if ((uint)(aVar5 + ~cmd_time_barrier_request) < 2) {
        broadcastToFederates
                  ((CommonCore *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                   (ActionMessage *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        return;
      }
      if (aVar5 != cmd_add_publisher) {
        if (aVar5 == cmd_pub) {
          routeMessage(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
          return;
        }
        if (aVar5 == cmd_log) {
LAB_0054d746:
          processLogAndErrorCommand(in_stack_fffffffffffff900._0_8_,cmd);
          return;
        }
        if (((aVar5 != cmd_add_filter) && (aVar5 != cmd_add_subscriber)) &&
           (aVar5 != cmd_add_endpoint)) {
          if (aVar5 != cmd_send_command_ordered) {
            if ((uint)(aVar5 + 0xffffff98) < 4) {
              checkForNamedInterface
                        ((CommonCore *)in_stack_fffffffffffff930._M_current,
                         in_stack_fffffffffffff928);
              return;
            }
            if ((uint)(aVar5 + 0xffffff84) < 4) {
              removeNamedTarget(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
              return;
            }
            if (aVar5 == cmd_close_interface) {
              disconnectInterface(in_stack_fffffffffffff720,
                                  (ActionMessage *)in_stack_fffffffffffff718);
              return;
            }
            if ((uint)(aVar5 + ~cmd_close_interface) < 4) {
              removeTargetFromInterface
                        (in_stack_fffffffffffff720,(ActionMessage *)in_stack_fffffffffffff718);
              return;
            }
            if (((1 < (uint)(aVar5 + ~(cmd_remove_publication|cmd_disconnect))) &&
                (1 < (uint)(aVar5 + ~(cmd_add_dependency|cmd_disconnect)))) &&
               (1 < (uint)(aVar5 + ~(cmd_add_dependent|cmd_disconnect)))) {
              if (aVar5 == cmd_core_configure) {
                processCoreConfigureCommands
                          (in_stack_fffffffffffff910,in_stack_fffffffffffff900._8_8_);
                return;
              }
              if (aVar5 == cmd_interface_tag) {
                pHVar12 = &in_RDI->loopHandles;
                ActionMessage::getSource
                          ((ActionMessage *)
                           CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
                this_00 = HandleManager::findHandle
                                    ((HandleManager *)
                                     CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                                     in_stack_fffffffffffff708);
                if (this_00 == (BasicHandleInfo *)0x0) {
                  return;
                }
                ActionMessage::getString_abi_cxx11_
                          (in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f4);
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
                ActionMessage::getString_abi_cxx11_
                          (in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f4);
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
                tag_00._M_str = (char *)in_stack_fffffffffffff750;
                tag_00._M_len = (size_t)in_stack_fffffffffffff748;
                value._M_str = in_stack_fffffffffffff740;
                value._M_len = (size_t)pHVar12;
                BasicHandleInfo::setTag(this_00,tag_00,value);
                return;
              }
              if (aVar5 == cmd_core_tag) {
                bVar3 = GlobalFederateId::operator==
                                  (&local_178->source_id,
                                   (GlobalBrokerId)
                                   (in_RDI->super_BrokerBase).global_broker_id_local.gid);
                if (!bVar3) {
                  return;
                }
                bVar3 = GlobalFederateId::operator==
                                  (&local_178->dest_id,
                                   (GlobalBrokerId)
                                   (in_RDI->super_BrokerBase).global_broker_id_local.gid);
                if (!bVar3) {
                  return;
                }
                ActionMessage::getString_abi_cxx11_
                          (in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f4);
                CLI::std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
                CLI::std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
                do {
                  bVar3 = __gnu_cxx::
                          operator==<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0
                                                ),
                                     (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8
                                                ));
                  if (((bVar3 ^ 0xffU) & 1) == 0) {
LAB_0054d95f:
                    ActionMessage::getString_abi_cxx11_
                              (in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f4);
                    std::
                    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff6f8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
                    return;
                  }
                  __gnu_cxx::
                  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator*((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&stack0xfffffffffffff930);
                  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_fffffffffffff710,
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_fffffffffffff708);
                  if (_Var1) {
                    ActionMessage::getString_abi_cxx11_
                              (in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f4);
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
                    goto LAB_0054d95f;
                  }
                  __gnu_cxx::
                  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator++((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&stack0xfffffffffffff930);
                } while( true );
              }
              if (aVar5 == cmd_check_connections) {
                local_417[2] = checkAndProcessDisconnect
                                         ((CommonCore *)
                                          CONCAT44(in_stack_fffffffffffff8bc,
                                                   in_stack_fffffffffffff8b8));
                local_417[1] = 0;
                gmlc::containers::
                DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
                ::begin((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
                         *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
                gmlc::containers::
                DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
                ::end((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
                       *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
                local_417[0] = std::
                               all_of<gmlc::containers::BlockIterator<helics::FedInfo_const,32,helics::FedInfo_const*const*>,helics::CommonCore::processCommand(helics::ActionMessage&&)::__0>
                                         ();
                local_454 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
                GlobalFederateId::GlobalFederateId(local_450,(GlobalBrokerId)local_454);
                getIdentifier_abi_cxx11_(in_RDI);
                local_468 = std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(uStack_424,uStack_428));
                pcVar14 = "CHECK CONNECTIONS {}, federates={}, fed_disconnected={}";
                uVar15 = 0x37;
                local_4b0 = gmlc::containers::
                            DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
                            ::size((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
                                    *)0x54ce44);
                local_78 = local_498;
                local_90 = local_417 + 2;
                local_98 = &local_4b0;
                local_a0 = local_417;
                local_18 = local_f8;
                local_19 = local_417[2] & 1;
                local_58 = local_e8;
                local_28 = local_d8;
                local_29 = local_417[0] & 1;
                local_8 = &local_c8;
                local_c8 = 0x747;
                args_00.desc_._4_4_ = in_stack_fffffffffffff954;
                args_00.desc_._0_4_ = in_stack_fffffffffffff950;
                args_00.field_1._0_4_ = in_stack_fffffffffffff958;
                args_00.field_1._4_4_ = in_stack_fffffffffffff95c;
                local_b8 = pcVar14;
                uStack_b0 = uVar15;
                local_88 = pcVar14;
                uStack_80 = uVar15;
                local_48 = local_58;
                local_10 = local_18;
                local_f8[0] = local_19;
                local_d8[0] = local_29;
                local_c0 = local_18;
                ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffff960,args_00);
                local_478 = std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(uStack_424,uStack_428));
                uVar8 = local_478._M_str._0_4_;
                uVar9 = local_478._M_str._4_4_;
                message_03._M_str = (char *)in_stack_fffffffffffff998;
                message_03._M_len = (size_t)in_stack_fffffffffffff990;
                BrokerBase::sendToLogger
                          (in_stack_fffffffffffff850,in_stack_fffffffffffff86c,
                           in_stack_fffffffffffff84c,in_stack_fffffffffffff858,message_03,
                           (bool)in_stack_fffffffffffff84b);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(uVar9,uVar8));
                return;
              }
              if (aVar5 == cmd_ping) goto LAB_0054c869;
              if (aVar5 == cmd_ping_reply) {
                local_2cc = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
                bVar3 = GlobalFederateId::operator==(&local_178->dest_id,(GlobalBrokerId)local_2cc);
                if (!bVar3) {
                  return;
                }
                std::
                unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>::
                operator->((unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
                            *)0x54c991);
                TimeoutMonitor::pingReply
                          ((TimeoutMonitor *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                           (CoreBroker *)
                           CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
                return;
              }
              if (aVar5 != cmd_timing_info) {
                if (aVar5 == cmd_grant_timeout_check) {
                  routeMessage(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
                  return;
                }
                if (aVar5 == cmd_profiler_data) {
                  if (((in_RDI->super_BrokerBase).enable_profiling & 1U) != 0) {
                    local_728 = SmallBuffer::to_string((SmallBuffer *)0x54db9b);
                    message._M_str = (char *)in_stack_fffffffffffff780;
                    message._M_len = (size_t)in_stack_fffffffffffff778;
                    BrokerBase::saveProfilingData(in_stack_fffffffffffff770,message);
                    return;
                  }
                  GlobalFederateId::GlobalFederateId(&local_72c,(GlobalBrokerId)0x0);
                  routeMessage(in_stack_fffffffffffff808,(ActionMessage *)in_stack_fffffffffffff800,
                               in_stack_fffffffffffff814);
                  return;
                }
                if (aVar5 == cmd_set_profiler_flag) {
                  routeMessage(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
                  return;
                }
                if (aVar5 == cmd_time_request) goto LAB_0054d166;
                if (aVar5 == cmd_null_message) {
LAB_0054d6ea:
                  FilterFederate::processFilterReturn
                            ((FilterFederate *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
                  return;
                }
                if (aVar5 == cmd_null_dest_message) {
LAB_0054d70b:
                  FilterFederate::processDestFilterReturn
                            ((FilterFederate *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
                  return;
                }
                if (((aVar5 == cmd_query_ordered) || (aVar5 == cmd_broker_query_ordered)) ||
                   (aVar5 == cmd_query_reply_ordered)) {
                  processQueryCommand(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
                  return;
                }
                if (((uint)(aVar5 + 0xfffffc16) < 2) || (aVar5 == cmd_disconnect_core_ack))
                goto LAB_0054d073;
                if (aVar5 == cmd_search_dependency) {
                  local_520 = ActionMessage::name((ActionMessage *)0x54d488);
                  federateName_00._M_str = in_stack_fffffffffffff740;
                  federateName_00._M_len = in_stack_fffffffffffff738;
                  local_510 = getFederateCore(in_stack_fffffffffffff730,federateName_00);
                  if (local_510 != (FederateState *)0x0) {
                    local_524 = std::atomic<helics::GlobalFederateId>::load
                                          (&local_510->global_id,seq_cst);
                    bVar3 = GlobalFederateId::isValid(&local_524);
                    if (bVar3) {
                      std::atomic<helics::GlobalFederateId>::load(&local_510->global_id,seq_cst);
                      ActionMessage::ActionMessage
                                ((ActionMessage *)in_stack_fffffffffffff708,
                                 in_stack_fffffffffffff704,
                                 (GlobalFederateId)
                                 (BaseType)((ulong)in_stack_fffffffffffff710 >> 0x20),
                                 (GlobalFederateId)(BaseType)in_stack_fffffffffffff710);
                      routeMessage(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
                      std::atomic<helics::GlobalFederateId>::load(&local_510->global_id,seq_cst);
                      ActionMessage::ActionMessage
                                ((ActionMessage *)in_stack_fffffffffffff708,
                                 in_stack_fffffffffffff704,
                                 (GlobalFederateId)
                                 (BaseType)((ulong)in_stack_fffffffffffff710 >> 0x20),
                                 (GlobalFederateId)(BaseType)in_stack_fffffffffffff710);
                      ActionMessage::operator=
                                ((ActionMessage *)
                                 CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                                 (ActionMessage *)
                                 CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
                      ActionMessage::~ActionMessage
                                ((ActionMessage *)
                                 CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
                      routeMessage(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
                      ActionMessage::~ActionMessage
                                ((ActionMessage *)
                                 CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
                      return;
                    }
                  }
                  (*(in_RDI->super_Core)._vptr_Core[0x6b])(in_RDI,0,local_178);
                  return;
                }
                if ((((aVar5 == cmd_remote_log) || (aVar5 == cmd_warning)) || (aVar5 == cmd_error))
                   || ((aVar5 == cmd_local_error || (aVar5 == cmd_global_error))))
                goto LAB_0054d746;
                if (aVar5 == cmd_resend) {
                  local_2d4 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
                  GlobalFederateId::GlobalFederateId(&local_2d0,(GlobalBrokerId)local_2d4);
                  startingAction = in_stack_fffffffffffff708.handle.hid;
                  getIdentifier_abi_cxx11_(in_RDI);
                  local_2e8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_fffffffffffff6f4,
                                                     in_stack_fffffffffffff6f0));
                  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                             (char *)in_stack_fffffffffffff6f8);
                  uVar8 = (undefined4)local_2fc._12_8_;
                  uVar9 = SUB84(local_2fc._12_8_,4);
                  message_01._M_str = (char *)in_stack_fffffffffffff998;
                  message_01._M_len = (size_t)in_stack_fffffffffffff990;
                  BrokerBase::sendToLogger
                            (in_stack_fffffffffffff850,in_stack_fffffffffffff86c,
                             in_stack_fffffffffffff84c,in_stack_fffffffffffff858,message_01,
                             (bool)in_stack_fffffffffffff84b);
                  if (local_178->messageID != -0x10000028) {
                    return;
                  }
                  local_2fc[0] = CLI::std::atomic<helics::GlobalBrokerId>::load
                                           (&(in_RDI->super_BrokerBase).global_id,seq_cst);
                  local_300 = 0;
                  bVar3 = GlobalBrokerId::operator==(local_2fc,(GlobalBrokerId)0x0);
                  bVar13 = 1;
                  if (!bVar3) {
                    local_304 = CLI::std::atomic<helics::GlobalBrokerId>::load
                                          (&(in_RDI->super_BrokerBase).global_id,seq_cst);
                    bVar3 = GlobalBrokerId::isValid(&local_304);
                    bVar13 = bVar3 ^ 0xff;
                  }
                  if ((bVar13 & 1) == 0) {
                    return;
                  }
                  local_30c = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
                  GlobalFederateId::GlobalFederateId(&local_308,(GlobalBrokerId)local_30c);
                  getIdentifier_abi_cxx11_(in_RDI);
                  local_320 = std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(uVar9,uVar8));
                  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                             (char *)in_stack_fffffffffffff6f8);
                  uVar8 = (undefined4)local_330;
                  uVar9 = (undefined4)((ulong)local_330 >> 0x20);
                  uVar10 = (undefined4)uStack_328;
                  uVar11 = (undefined4)((ulong)uStack_328 >> 0x20);
                  message_02._M_str = (char *)in_stack_fffffffffffff998;
                  message_02._M_len = (size_t)in_stack_fffffffffffff990;
                  BrokerBase::sendToLogger
                            (in_stack_fffffffffffff850,in_stack_fffffffffffff86c,
                             in_stack_fffffffffffff84c,in_stack_fffffffffffff858,message_02,
                             (bool)in_stack_fffffffffffff84b);
                  ActionMessage::ActionMessage
                            ((ActionMessage *)in_stack_fffffffffffff710,startingAction.hid);
                  GVar6.gid = 0;
                  GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xfffffffffffffc14);
                  local_3e8.source_id.gid = GVar6.gid;
                  getIdentifier_abi_cxx11_(in_RDI);
                  std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(uVar11,uVar10));
                  name._M_len._4_4_ = uVar9;
                  name._M_len._0_4_ = uVar8;
                  name._M_str._0_4_ = uVar10;
                  name._M_str._4_4_ = uVar11;
                  ActionMessage::name((ActionMessage *)0x54cc34,name);
                  getAddress_abi_cxx11_(in_stack_fffffffffffff710);
                  local_410 = std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(uVar11,uVar10));
                  string1._M_str._0_4_ = in_stack_fffffffffffff700;
                  string1._M_len = (size_t)in_stack_fffffffffffff6f8;
                  string1._M_str._4_4_ = in_stack_fffffffffffff704;
                  ActionMessage::setStringData((ActionMessage *)CONCAT44(uVar11,uVar10),string1);
                  setActionFlag<helics::ActionMessage,helics::ConnectionFlags>(&local_3e8,core_flag)
                  ;
                  local_3e8.counter = 1;
                  local_414 = 0;
                  (*(in_RDI->super_Core)._vptr_Core[0x6b])(in_RDI,0,&local_3e8);
                  ActionMessage::~ActionMessage((ActionMessage *)CONCAT44(uVar11,uVar10));
                  return;
                }
                if (aVar5 != cmd_send_message) {
                  if (((uint)(aVar5 + 0xefffffe2) < 2) || (aVar5 == cmd_send_for_filter_return)) {
                    this_01 = &local_178->dest_id;
                    GVar6 = std::atomic<helics::GlobalFederateId>::load
                                      (&in_RDI->filterFedID,seq_cst);
                    bVar3 = GlobalFederateId::operator==(this_01,GVar6);
                    if (!bVar3) {
                      return;
                    }
                    FilterFederate::processMessageFilter
                              ((FilterFederate *)
                               CONCAT44(in_stack_fffffffffffffc14.gid,in_stack_fffffffffffffc10),
                               cmd_00);
                    return;
                  }
                  if (aVar5 == cmd_filter_result) goto LAB_0054d6ea;
                  if (aVar5 != cmd_dest_filter_result) {
                    if ((((aVar5 == cmd_reg_pub) || (aVar5 == cmd_reg_filter)) ||
                        (aVar5 == cmd_reg_input)) ||
                       (((aVar5 == cmd_reg_translator || (aVar5 == cmd_reg_end)) ||
                        (aVar5 == cmd_reg_datasink)))) {
                      registerInterface(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
                      return;
                    }
                    if (((aVar5 != cmd_data_link) && (aVar5 != cmd_filter_link)) &&
                       ((aVar5 != cmd_endpoint_link && (aVar5 != cmd_add_alias)))) {
                      bVar3 = isPriorityCommand((ActionMessage *)0x54dd81);
                      if (bVar3) {
                        processPriorityCommand(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
                        return;
                      }
                      bVar3 = isLocal(in_stack_fffffffffffff718,
                                      (GlobalFederateId)
                                      (BaseType)((ulong)in_stack_fffffffffffff720 >> 0x20));
                      if (!bVar3) {
                        return;
                      }
                      routeMessage(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
                      return;
                    }
                    processLinkingCommand
                              (in_stack_fffffffffffff870,
                               (ActionMessage *)
                               CONCAT44(in_stack_fffffffffffff86c.gid,in_stack_fffffffffffff868));
                    return;
                  }
                  goto LAB_0054d70b;
                }
                bVar3 = checkActionFlag<helics::ActionMessage,helics::MessageFlags>
                                  (local_178,filter_processing_required_flag);
                GVar6.gid = (BaseType)((ulong)in_stack_fffffffffffff720 >> 0x20);
                if (!bVar3) {
                  local_714 = 0;
                  bVar3 = GlobalFederateId::operator==(&local_178->dest_id,(GlobalBrokerId)0x0);
                  if (bVar3) {
                    local_718 = (local_178->source_id).gid;
                    bVar3 = isLocal(in_stack_fffffffffffff718,GVar6);
                    if (bVar3) goto LAB_0054db27;
                  }
                  deliverMessage(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
                  return;
                }
LAB_0054db27:
                processMessage((CommonCore *)in_stack_fffffffffffff708,
                               (ActionMessage *)
                               CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
                deliverMessage(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
                return;
              }
            }
            routeMessage(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
            return;
          }
          local_4c8 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
          bVar3 = GlobalFederateId::operator==(&local_178->dest_id,(GlobalBrokerId)local_4c8);
          GVar6.gid = (BaseType)((ulong)in_stack_fffffffffffff720 >> 0x20);
          if (bVar3) {
            processCommandInstruction(in_stack_fffffffffffff888,in_stack_fffffffffffff880);
            return;
          }
          local_4cc = 0;
          bVar3 = GlobalFederateId::operator==(&local_178->dest_id,(GlobalBrokerId)0x0);
          if (!bVar3) {
LAB_0054d3e0:
            federateID.gid = (BaseType)((ulong)in_stack_fffffffffffff730 >> 0x20);
            local_4f4 = (local_178->dest_id).gid;
            bVar3 = isLocal(in_stack_fffffffffffff718,GVar6);
            if (bVar3) {
              local_504 = (local_178->dest_id).gid;
              local_500 = getFederateCore(in_stack_fffffffffffff728,federateID);
              if (local_500 != (FederateState *)0x0) {
                FederateState::sendCommand(in_stack_00000028,in_stack_00000020);
                return;
              }
              local_500 = (FederateState *)0x0;
            }
            routeMessage(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
            return;
          }
          local_4d8 = ActionMessage::getString_abi_cxx11_
                                (in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f4);
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                                  (char *)CONCAT44(in_stack_fffffffffffff6ec,
                                                   in_stack_fffffffffffff6e8));
          if (!bVar3) {
            getIdentifier_abi_cxx11_(in_RDI);
            _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff710,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff708);
            if (!_Var1) {
              local_4f0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0
                                                ));
              federateName._M_str = in_stack_fffffffffffff740;
              federateName._M_len = in_stack_fffffffffffff738;
              local_4e0 = getFederateCore(in_stack_fffffffffffff730,federateName);
              if (local_4e0 != (FederateState *)0x0) {
                FederateState::sendCommand(in_stack_00000028,in_stack_00000020);
                return;
              }
              local_4e0 = (FederateState *)0x0;
              goto LAB_0054d3e0;
            }
          }
          processCommandInstruction(in_stack_fffffffffffff888,in_stack_fffffffffffff880);
          return;
        }
      }
      addTargetToInterface(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
      return;
    }
    local_4b4 = (in_RDI->keyFed).gid;
    bVar3 = GlobalFederateId::operator==(&local_178->source_id,(GlobalFederateId)local_4b4);
    if (bVar3) {
      std::__atomic_float<double>::store
                (&(in_RDI->simTime).super___atomic_float<double>,0.0,seq_cst);
    }
  }
  processExecRequest(in_stack_fffffffffffff7c0,
                     (ActionMessage *)CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8))
  ;
  return;
}

Assistant:

void CommonCore::processCommand(ActionMessage&& command)
{
    LOG_TRACE(global_broker_id_local,
              getIdentifier(),
              fmt::format("|| cmd:{} from {}",
                          prettyPrintString(command),
                          command.source_id.baseValue()));
    switch (command.action()) {
        case CMD_IGNORE:
            break;
        case CMD_TICK:
            processTimingTick(command);
            break;
        case CMD_PING:
        case CMD_BROKER_PING:  // broker ping for core is the same as core
            if (command.dest_id == global_broker_id_local) {
                ActionMessage pngrep(CMD_PING_REPLY);
                pngrep.dest_id = command.source_id;
                pngrep.source_id = global_broker_id_local;
                routeMessage(pngrep);
            }
            break;
        case CMD_PING_REPLY:
            if (command.dest_id == global_broker_id_local) {
                timeoutMon->pingReply(command);
            }
            break;
        case CMD_RESEND:
            LOG_WARNING_SIMPLE("got resend");
            if (command.messageID == static_cast<int32_t>(CMD_REG_BROKER)) {
                if ((global_id.load() == parent_broker_id) || (!(global_id.load().isValid()))) {
                    LOG_WARNING_SIMPLE("resending broker reg");
                    ActionMessage reg(CMD_REG_BROKER);
                    reg.source_id = GlobalFederateId{};
                    reg.name(getIdentifier());
                    reg.setStringData(getAddress());
                    setActionFlag(reg, core_flag);
                    reg.counter = 1;
                    transmit(parent_route_id, reg);
                }
            }
            break;
        case CMD_TIME_BARRIER:
        case CMD_TIME_BARRIER_CLEAR:
            broadcastToFederates(command);
            break;
        case CMD_CHECK_CONNECTIONS: {
            auto res = checkAndProcessDisconnect();
            auto pred = [](const auto& fed) {
                auto state = fed->getState();
                return (FederateStates::FINISHED == state) || (FederateStates::ERRORED == state);
            };
            auto afed = std::all_of(loopFederates.begin(), loopFederates.end(), pred);
            LOG_WARNING(global_broker_id_local,
                        getIdentifier(),
                        fmt::format("CHECK CONNECTIONS {}, federates={}, fed_disconnected={}",
                                    res,
                                    loopFederates.size(),
                                    afed));
        }

        break;
        case CMD_USER_DISCONNECT:
        case CMD_GLOBAL_DISCONNECT:
        case CMD_BROADCAST_DISCONNECT:
        case CMD_STOP:
        case CMD_DISCONNECT:
        case CMD_DISCONNECT_FED:
        case CMD_DISCONNECT_CHECK:
        case CMD_DISCONNECT_CORE_ACK:
        case CMD_TIMEOUT_DISCONNECT:
            processDisconnectCommand(command);
            break;
        case CMD_EXEC_GRANT:
            if (command.source_id == keyFed) {
                simTime.store(0.0);
            }
            [[fallthrough]];
        case CMD_EXEC_REQUEST:
            processExecRequest(command);
            break;
        case CMD_TIME_GRANT:
            if (command.source_id == keyFed) {
                simTime.store(static_cast<double>(command.actionTime));
            }
            [[fallthrough]];
        case CMD_TIME_REQUEST:
            if (isLocal(command.source_id)) {
                if (hasTimeBlock(command.source_id)) {
                    delayedTimingMessages[command.source_id.baseValue()].push_back(command);
                    break;
                }
            }
            routeMessage(command);
            break;
        case CMD_GRANT_TIMEOUT_CHECK:
            routeMessage(command);
            break;
        case CMD_TIME_BLOCK:
        case CMD_TIME_UNBLOCK:
            manageTimeBlocks(command);
            break;
        case CMD_BROKER_QUERY_ORDERED:
        case CMD_QUERY_ORDERED:
        case CMD_QUERY_REPLY_ORDERED:
            processQueryCommand(command);
            break;
        case CMD_SEND_COMMAND_ORDERED:
            if (command.dest_id == global_broker_id_local) {
                processCommandInstruction(command);
                break;
            }
            if (command.dest_id == parent_broker_id) {
                const auto& target = command.getString(targetStringLoc);
                if (target == "core" || target == getIdentifier()) {
                    processCommandInstruction(command);
                    break;
                }
                auto* fed = getFederateCore(target);
                if (fed != nullptr) {
                    fed->sendCommand(command);
                    break;
                }
            }
            if (isLocal(command.dest_id)) {
                auto* fed = getFederateCore(command.dest_id);
                if (fed != nullptr) {
                    fed->sendCommand(command);
                    break;
                }
            }
            routeMessage(std::move(command));
            break;
        case CMD_SEARCH_DEPENDENCY: {
            auto* fed = getFederateCore(command.name());
            if (fed != nullptr) {
                if (fed->global_id.load().isValid()) {
                    ActionMessage dep(CMD_ADD_DEPENDENCY, fed->global_id.load(), command.source_id);
                    routeMessage(dep);
                    dep =
                        ActionMessage(CMD_ADD_DEPENDENT, command.source_id, fed->global_id.load());
                    routeMessage(dep);
                    break;
                }
            }
            // it is not found send to broker
            transmit(parent_route_id, command);
        } break;
        case CMD_ADD_DEPENDENCY:
        case CMD_REMOVE_DEPENDENCY:
        case CMD_ADD_DEPENDENT:
        case CMD_REMOVE_DEPENDENT:
        case CMD_ADD_INTERDEPENDENCY:
        case CMD_REMOVE_INTERDEPENDENCY:
        case CMD_TIMING_INFO:
            routeMessage(command);
            break;
        case CMD_SEND_FOR_FILTER:
        case CMD_SEND_FOR_FILTER_AND_RETURN:
        case CMD_SEND_FOR_DEST_FILTER_AND_RETURN:
            if (command.dest_id == filterFedID.load()) {
                filterFed->processMessageFilter(command);
            }
            break;
        case CMD_NULL_MESSAGE:
        case CMD_FILTER_RESULT:
            // if (command.dest_id == filterFedID.load()) {
            filterFed->processFilterReturn(command);
            //  }
            break;
        case CMD_DEST_FILTER_RESULT:
        case CMD_NULL_DEST_MESSAGE:
            //  if (command.dest_id == filterFedID) {
            filterFed->processDestFilterReturn(command);
            //  }
            break;
        case CMD_PUB:
            routeMessage(command);
            break;
        case CMD_LOG:
        case CMD_REMOTE_LOG:
        case CMD_WARNING:
        case CMD_ERROR:
        case CMD_LOCAL_ERROR:
        case CMD_GLOBAL_ERROR:
            processLogAndErrorCommand(command);
            break;
        case CMD_DATA_LINK:
        case CMD_ENDPOINT_LINK:
        case CMD_FILTER_LINK:
        case CMD_ADD_ALIAS:
            processLinkingCommand(command);
            break;
        case CMD_REG_INPUT:
        case CMD_REG_ENDPOINT:
        case CMD_REG_DATASINK:
        case CMD_REG_PUB:
        case CMD_REG_FILTER:
        case CMD_REG_TRANSLATOR:
            registerInterface(command);
            break;
        case CMD_ADD_NAMED_ENDPOINT:
        case CMD_ADD_NAMED_PUBLICATION:
        case CMD_ADD_NAMED_INPUT:
        case CMD_ADD_NAMED_FILTER:
            checkForNamedInterface(command);
            break;
        case CMD_ADD_ENDPOINT:
        case CMD_ADD_FILTER:
        case CMD_ADD_SUBSCRIBER:
        case CMD_ADD_PUBLISHER:
            addTargetToInterface(command);
            break;
        case CMD_REMOVE_NAMED_ENDPOINT:
        case CMD_REMOVE_NAMED_PUBLICATION:
        case CMD_REMOVE_NAMED_INPUT:
        case CMD_REMOVE_NAMED_FILTER:
            removeNamedTarget(command);
            break;
        case CMD_REMOVE_PUBLICATION:
        case CMD_REMOVE_SUBSCRIBER:
        case CMD_REMOVE_FILTER:
        case CMD_REMOVE_ENDPOINT:
            removeTargetFromInterface(command);
            break;
        case CMD_CLOSE_INTERFACE:
            disconnectInterface(command);
            break;
        case CMD_CORE_TAG:
            if (command.source_id == global_broker_id_local &&
                command.dest_id == global_broker_id_local) {
                const auto& keyTag = command.getString(0);
                for (auto& tag : tags) {
                    if (tag.first == keyTag) {
                        tag.second = command.getString(1);
                        break;
                    }
                }
                tags.emplace_back(keyTag, command.getString(1));
            }
            break;
        case CMD_CORE_CONFIGURE:
            processCoreConfigureCommands(command);
            break;
        case CMD_INTERFACE_TAG: {
            auto* handle = loopHandles.findHandle(command.getSource());
            if (handle != nullptr) {
                handle->setTag(command.getString(0), command.getString(1));
            }
            break;
        }
        case CMD_INIT:
        case CMD_INIT_GRANT:
            processInitRequest(command);
            break;
        case CMD_SEND_MESSAGE:
            if (checkActionFlag(command, filter_processing_required_flag) ||
                ((command.dest_id == parent_broker_id) && (isLocal(command.source_id)))) {
                deliverMessage(processMessage(command));
            } else {
                deliverMessage(command);
            }

            break;
        case CMD_PROFILER_DATA:
            if (enable_profiling) {
                saveProfilingData(command.payload.to_string());
            } else {
                routeMessage(std::move(command), parent_broker_id);
            }
            break;
        case CMD_SET_PROFILER_FLAG:
            routeMessage(command);
            break;
        case CMD_REQUEST_CURRENT_TIME:
            if (isLocal(command.dest_id)) {
                auto* fed = getFederateCore(command.dest_id);
                if (fed != nullptr) {
                    if ((fed->getState() != FederateStates::FINISHED) &&
                        (fed->getState() != FederateStates::ERRORED)) {
                        fed->forceProcessMessage(command);
                    } else {
                        auto rep = fed->processPostTerminationAction(command);
                        if (rep) {
                            routeMessage(*rep);
                        }
                    }
                }
            } else {
                routeMessage(command);
            }
            break;
        default:
            if (isPriorityCommand(command)) {
                // this is a backup if somehow one of these message got here
                processPriorityCommand(std::move(command));
            } else if (isLocal(command.dest_id)) {
                routeMessage(command);
            }
            break;
    }
}